

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Arbitrary.h
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* cppqc::detail::
  ArbitraryString<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::shrink(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *x)

{
  bool bVar1;
  reference pvVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  const_iterator it;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *ret;
  reference in_stack_ffffffffffffff18;
  iterator in_stack_ffffffffffffff20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  iterator in_stack_ffffffffffffff58;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffff60;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffff68;
  string local_58 [32];
  undefined8 local_38;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_30 [3];
  undefined1 local_11;
  
  local_11 = 0;
  this = in_RDI;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x134701);
  std::__cxx11::string::size();
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::reserve((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)this,(size_type)in_RDI);
  local_30[0]._M_current = (char *)std::__cxx11::string::begin();
  while( true ) {
    local_38 = std::__cxx11::string::end();
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)in_stack_ffffffffffffff20._M_current,
                       (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)in_stack_ffffffffffffff18);
    if (!bVar1) break;
    std::__cxx11::string::string(local_58);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_ffffffffffffff20._M_current,in_stack_ffffffffffffff18);
    std::__cxx11::string::~string(local_58);
    pvVar2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_ffffffffffffff20._M_current);
    std::__cxx11::string::size();
    std::__cxx11::string::reserve((ulong)pvVar2);
    pvVar2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_ffffffffffffff20._M_current);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffff20._M_current);
    std::__cxx11::string::end();
    __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
              ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)in_stack_ffffffffffffff20._M_current,
               (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)in_stack_ffffffffffffff18);
    std::__cxx11::string::begin();
    std::__cxx11::string::
    insert<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,void>
              (this,(const_iterator)in_stack_ffffffffffffff68._M_current,in_stack_ffffffffffffff60,
               (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )in_stack_ffffffffffffff58._M_current);
    in_stack_ffffffffffffff18 =
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_ffffffffffffff20._M_current);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffff20._M_current);
    std::__cxx11::string::end();
    __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
              ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)in_stack_ffffffffffffff20._M_current,
               (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)in_stack_ffffffffffffff18);
    in_stack_ffffffffffffff68 =
         __gnu_cxx::
         __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         ::operator+((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)pvVar2,in_stack_ffffffffffffff20._M_current);
    in_stack_ffffffffffffff60._M_current = (char *)std::__cxx11::string::end();
    in_stack_ffffffffffffff20 =
         std::__cxx11::string::
         insert<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,void>
                   (this,in_stack_ffffffffffffff68._M_current,in_stack_ffffffffffffff60,
                    in_stack_ffffffffffffff58._M_current);
    in_stack_ffffffffffffff58 = in_stack_ffffffffffffff20;
    __gnu_cxx::
    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(local_30);
  }
  return (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)in_RDI;
}

Assistant:

static std::vector<String> shrink(const String& x) {
    std::vector<String> ret;
    ret.reserve(x.size());
    for (auto it = x.begin(); it != x.end(); ++it) {
      ret.push_back(String());
      ret.back().reserve(x.size() - 1);
      ret.back().insert(ret.back().end(), x.begin(), it);
      ret.back().insert(ret.back().end(), it + 1, x.end());
    }
    return ret;
  }